

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

char * unescape_word(char *input)

{
  char cVar1;
  char *pcVar2;
  CURLcode local_44;
  char ch;
  char *pcStack_40;
  CURLcode result;
  char *ptr;
  dynbuf out;
  char *input_local;
  
  local_44 = CURLE_OK;
  out.toobig = (size_t)input;
  Curl_dyn_init((dynbuf *)&ptr,10000);
  pcStack_40 = (char *)out.toobig;
  while( true ) {
    if (*pcStack_40 == '\0') {
      pcVar2 = Curl_dyn_ptr((dynbuf *)&ptr);
      return pcVar2;
    }
    cVar1 = *pcStack_40;
    if ((((cVar1 < '!') || (cVar1 == '\x7f')) || (cVar1 == '\'')) ||
       ((cVar1 == '\"' || (cVar1 == '\\')))) {
      local_44 = Curl_dyn_addn((dynbuf *)&ptr,"\\",1);
    }
    if (local_44 == CURLE_OK) {
      local_44 = Curl_dyn_addn((dynbuf *)&ptr,pcStack_40,1);
    }
    if (local_44 != CURLE_OK) break;
    pcStack_40 = pcStack_40 + 1;
  }
  return (char *)0x0;
}

Assistant:

static char *unescape_word(const char *input)
{
  struct dynbuf out;
  const char *ptr;
  CURLcode result = CURLE_OK;
  Curl_dyn_init(&out, DYN_DICT_WORD);

  /* According to RFC2229 section 2.2, these letters need to be escaped with
     \[letter] */
  for(ptr = input; *ptr; ptr++) {
    char ch = *ptr;
    if((ch <= 32) || (ch == 127) ||
       (ch == '\'') || (ch == '\"') || (ch == '\\'))
      result = Curl_dyn_addn(&out, "\\", 1);
    if(!result)
      result = Curl_dyn_addn(&out, ptr, 1);
    if(result)
      return NULL;
  }
  return Curl_dyn_ptr(&out);
}